

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCxxModuleMapper.cxx
# Opt level: O0

CxxBmiLocation * __thiscall
CxxModuleLocations::BmiGeneratorPathForModule
          (CxxBmiLocation *__return_storage_ptr__,CxxModuleLocations *this,string *logical_name)

{
  bool bVar1;
  string *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  CxxBmiLocation local_50;
  undefined1 local_21;
  string *local_20;
  string *logical_name_local;
  CxxModuleLocations *this_local;
  CxxBmiLocation *bmi_loc;
  
  local_21 = 0;
  local_20 = logical_name;
  logical_name_local = &this->RootDirectory;
  this_local = (CxxModuleLocations *)__return_storage_ptr__;
  std::
  function<CxxBmiLocation_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::operator()(__return_storage_ptr__,&this->BmiLocationForModule,logical_name);
  bVar1 = CxxBmiLocation::IsKnown(__return_storage_ptr__);
  if ((bVar1) && (bVar1 = CxxBmiLocation::IsPrivate(__return_storage_ptr__), !bVar1)) {
    psVar2 = CxxBmiLocation::Location_abi_cxx11_(__return_storage_ptr__);
    std::__cxx11::string::string((string *)&local_90,(string *)psVar2);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
    ::operator()(&local_70,&this->PathForGenerator,&local_90);
    CxxBmiLocation::Known(&local_50,&local_70);
    CxxBmiLocation::operator=(__return_storage_ptr__,&local_50);
    CxxBmiLocation::~CxxBmiLocation(&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

CxxBmiLocation CxxModuleLocations::BmiGeneratorPathForModule(
  std::string const& logical_name) const
{
  auto bmi_loc = this->BmiLocationForModule(logical_name);
  if (bmi_loc.IsKnown() && !bmi_loc.IsPrivate()) {
    bmi_loc =
      CxxBmiLocation::Known(this->PathForGenerator(bmi_loc.Location()));
  }
  return bmi_loc;
}